

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_enumerate(char *_fn,PHYSFS_EnumerateCallback cb,void *data)

{
  long *dst;
  __PHYSFS_DIRHANDLE__ **pp_Var1;
  DirHandle *h;
  void *pvVar2;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var3;
  PHYSFS_Archiver *pPVar4;
  void *pvVar5;
  _func_PHYSFS_EnumerateCallbackResult_void_ptr_char_ptr_PHYSFS_EnumerateCallback_char_ptr_void_ptr
  *p_Var6;
  long *plVar7;
  char *pcVar8;
  int iVar9;
  PHYSFS_EnumerateCallbackResult PVar10;
  size_t sVar11;
  long *plVar12;
  long lVar13;
  ErrState *pEVar14;
  long *plVar15;
  PHYSFS_ErrorCode errcode;
  void **retval;
  __PHYSFS_DIRHANDLE__ *h_00;
  uint uVar16;
  bool bVar17;
  long lStack_a8;
  undefined1 local_a0 [8];
  PHYSFS_Stat statbuf;
  long *local_48;
  char *arcfname;
  void *local_38;
  
  plVar15 = &lStack_a8;
  if ((_fn == (char *)0x0) || (cb == (PHYSFS_EnumerateCallback)0x0)) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
LAB_00108122:
    PHYSFS_setErrorCode(errcode);
    uVar16 = 0;
  }
  else {
    sVar11 = strlen(_fn);
    if (sVar11 + 1 < 0x100) {
      plVar15 = (long *)((long)&lStack_a8 - (sVar11 + 0x18 & 0xfffffffffffffff0));
      lVar13 = 0;
      plVar12 = plVar15;
    }
    else {
      plVar12 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar11 + 9);
      if (plVar12 == (long *)0x0) {
        errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        goto LAB_00108122;
      }
      lVar13 = 1;
    }
    *plVar12 = lVar13;
    dst = plVar12 + 1;
    plVar15[-1] = 0x108161;
    iVar9 = sanitizePlatformIndependentPath(_fn,(char *)dst);
    if (iVar9 == 0) {
      uVar16 = 1;
    }
    else {
      plVar15[-1] = 0x108179;
      __PHYSFS_platformGrabMutex(stateLock);
      if (allowSymLinks == 0) {
        statbuf._32_8_ = cb;
      }
      h_00 = searchPath;
      arcfname = (char *)cb;
      pvVar2 = data;
      if (searchPath == (DirHandle *)0x0) {
        uVar16 = 1;
      }
      else {
        do {
          local_38 = pvVar2;
          h = (DirHandle *)h_00->mountPoint;
          local_48 = dst;
          plVar15[-1] = 0x1081c2;
          iVar9 = partOfMountPoint(h,(char *)dst);
          pcVar8 = arcfname;
          if (iVar9 == 0) {
            plVar15[-1] = 0x1081ed;
            iVar9 = verifyPath(h_00,(char **)&local_48,0);
            plVar7 = local_48;
            if (iVar9 == 0) {
              PVar10 = PHYSFS_ENUM_OK;
            }
            else {
              pvVar2 = h_00->opaque;
              p_Var3 = h_00->funcs->stat;
              plVar15[-1] = 0x10820b;
              iVar9 = (*p_Var3)(pvVar2,(char *)plVar7,(PHYSFS_Stat *)local_a0);
              if (iVar9 == 0) {
                plVar15[-1] = 0x108222;
                pEVar14 = findErrorForCurrentThread();
                if (pEVar14 == (ErrState *)0x0) {
                  bVar17 = true;
                }
                else {
                  bVar17 = pEVar14->code != PHYSFS_ERR_NOT_FOUND;
                }
                PVar10 = PHYSFS_ENUM_OK;
                data = local_38;
                if (!bVar17) goto LAB_0010826a;
              }
              pvVar2 = local_38;
              pcVar8 = arcfname;
              PVar10 = PHYSFS_ENUM_OK;
              data = local_38;
              if ((int)statbuf.accesstime == 1) {
                pPVar4 = h_00->funcs;
                if ((allowSymLinks == 0) && ((pPVar4->info).supportsSymlinks != 0)) {
                  pvVar2 = h_00->opaque;
                  p_Var6 = pPVar4->enumerate;
                  plVar15[-1] = 0x1082ac;
                  PVar10 = (*p_Var6)(pvVar2,(char *)plVar7,enumCallbackFilterSymLinks,_fn,
                                     &statbuf.filetype);
                  data = local_38;
                  if (PVar10 == PHYSFS_ENUM_ERROR) {
                    plVar15[-1] = 0x1082b8;
                    pEVar14 = findErrorForCurrentThread();
                    PVar10 = PHYSFS_ENUM_ERROR;
                    data = local_38;
                    if ((pEVar14 != (ErrState *)0x0) && (pEVar14->code == PHYSFS_ERR_APP_CALLBACK))
                    {
                      plVar15[-1] = 0x1082d0;
                      PHYSFS_setErrorCode(PHYSFS_ERR_OK);
                      data = local_38;
                    }
                  }
                }
                else {
                  pvVar5 = h_00->opaque;
                  p_Var6 = pPVar4->enumerate;
                  plVar15[-1] = 0x108264;
                  PVar10 = (*p_Var6)(pvVar5,(char *)plVar7,(PHYSFS_EnumerateCallback)pcVar8,_fn,
                                     pvVar2);
                  data = local_38;
                }
              }
            }
          }
          else {
            plVar15[-1] = 0x1081db;
            PVar10 = enumerateFromMountPoint
                               (h_00,(char *)dst,(PHYSFS_EnumerateCallback)pcVar8,_fn,data);
          }
LAB_0010826a:
        } while ((PVar10 == PHYSFS_ENUM_OK) &&
                (pp_Var1 = &h_00->next, h_00 = *pp_Var1, pvVar2 = local_38,
                *pp_Var1 != (__PHYSFS_DIRHANDLE__ *)0x0));
        uVar16 = (uint)(PVar10 != PHYSFS_ENUM_ERROR);
      }
      plVar15[-1] = 0x1082f8;
      __PHYSFS_platformReleaseMutex(stateLock);
    }
    if (*plVar12 != 0) {
      plVar15[-1] = 0x10830c;
      (*__PHYSFS_AllocatorHooks.Free)(plVar12);
    }
  }
  return uVar16;
}

Assistant:

int PHYSFS_enumerate(const char *_fn, PHYSFS_EnumerateCallback cb, void *data)
{
    PHYSFS_EnumerateCallbackResult retval = PHYSFS_ENUM_OK;
    size_t len;
    char *fname;

    BAIL_IF(!_fn, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!cb, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    len = strlen(_fn) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);

    if (!sanitizePlatformIndependentPath(_fn, fname))
        retval = PHYSFS_ENUM_STOP;
    else
    {
        DirHandle *i;
        SymlinkFilterData filterdata;

        __PHYSFS_platformGrabMutex(stateLock);

        if (!allowSymLinks)
        {
            memset(&filterdata, '\0', sizeof (filterdata));
            filterdata.callback = cb;
            filterdata.callbackData = data;
        } /* if */

        for (i = searchPath; (retval == PHYSFS_ENUM_OK) && i; i = i->next)
        {
            char *arcfname = fname;

            if (partOfMountPoint(i, arcfname))
                retval = enumerateFromMountPoint(i, arcfname, cb, _fn, data);

            else if (verifyPath(i, &arcfname, 0))
            {
                PHYSFS_Stat statbuf;
                if (!i->funcs->stat(i->opaque, arcfname, &statbuf))
                {
                    if (currentErrorCode() == PHYSFS_ERR_NOT_FOUND)
                        continue;  /* no such dir in this archive, skip it. */
                } /* if */

                if (statbuf.filetype != PHYSFS_FILETYPE_DIRECTORY)
                    continue;  /* not a directory in this archive, skip it. */

                else if ((!allowSymLinks) && (i->funcs->info.supportsSymlinks))
                {
                    filterdata.dirhandle = i;
                    filterdata.arcfname = arcfname;
                    filterdata.errcode = PHYSFS_ERR_OK;
                    retval = i->funcs->enumerate(i->opaque, arcfname,
                                                 enumCallbackFilterSymLinks,
                                                 _fn, &filterdata);
                    if (retval == PHYSFS_ENUM_ERROR)
                    {
                        if (currentErrorCode() == PHYSFS_ERR_APP_CALLBACK)
                            PHYSFS_setErrorCode(filterdata.errcode);
                    } /* if */
                } /* else if */
                else
                {
                    retval = i->funcs->enumerate(i->opaque, arcfname,
                                                 cb, _fn, data);
                } /* else */
            } /* else if */
        } /* for */

        __PHYSFS_platformReleaseMutex(stateLock);
    } /* if */

    __PHYSFS_smallFree(fname);

    return (retval == PHYSFS_ENUM_ERROR) ? 0 : 1;
}